

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void cram_free_slice_header(cram_block_slice_hdr *hdr)

{
  if (hdr != (cram_block_slice_hdr *)0x0) {
    if (hdr->block_content_ids != (int32_t *)0x0) {
      free(hdr->block_content_ids);
    }
    free(hdr);
    return;
  }
  return;
}

Assistant:

void cram_free_slice_header(cram_block_slice_hdr *hdr) {
    if (!hdr)
	return;

    if (hdr->block_content_ids)
	free(hdr->block_content_ids);

    free(hdr);

    return;
}